

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant_common.c
# Opt level: O2

qm_val_t *
av1_get_iqmatrix(CommonQuantParams *quant_params,MACROBLOCKD *xd,int plane,TX_SIZE tx_size,
                TX_TYPE tx_type)

{
  byte bVar1;
  qm_val_t **ppqVar2;
  
  bVar1 = av1_get_adjusted_tx_size(tx_size);
  if (tx_type < 9) {
    ppqVar2 = xd->plane[plane].seg_iqmatrix[*(ushort *)&(*xd->mi)->field_0xa7 & 7] + bVar1;
  }
  else {
    ppqVar2 = quant_params->giqmatrix[0xf][0] + bVar1;
  }
  return *ppqVar2;
}

Assistant:

const qm_val_t *av1_get_iqmatrix(const CommonQuantParams *quant_params,
                                 const MACROBLOCKD *xd, int plane,
                                 TX_SIZE tx_size, TX_TYPE tx_type) {
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  const MB_MODE_INFO *const mbmi = xd->mi[0];
  const int seg_id = mbmi->segment_id;
  const TX_SIZE qm_tx_size = av1_get_adjusted_tx_size(tx_size);
  // Use a flat matrix (i.e. no weighting) for 1D and Identity transforms
  return is_2d_transform(tx_type)
             ? pd->seg_iqmatrix[seg_id][qm_tx_size]
             : quant_params->giqmatrix[NUM_QM_LEVELS - 1][0][qm_tx_size];
}